

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ExplicitAnsiPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExplicitAnsiPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,ExpressionSyntax **args_5,
          Token *args_6)

{
  ExpressionSyntax *pEVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  Info *pIVar5;
  Info *pIVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  TokenKind TVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  TokenKind TVar15;
  undefined1 uVar16;
  NumericTokenFlags NVar17;
  uint32_t uVar18;
  TokenKind TVar19;
  undefined1 uVar20;
  NumericTokenFlags NVar21;
  uint32_t uVar22;
  TokenKind TVar23;
  undefined1 uVar24;
  NumericTokenFlags NVar25;
  uint32_t uVar26;
  ExplicitAnsiPortSyntax *this_00;
  
  this_00 = (ExplicitAnsiPortSyntax *)allocate(this,0x98,8);
  TVar7 = args_1->kind;
  uVar8 = args_1->field_0x2;
  NVar9.raw = (args_1->numFlags).raw;
  uVar10 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar11 = args_2->kind;
  uVar12 = args_2->field_0x2;
  NVar13.raw = (args_2->numFlags).raw;
  uVar14 = args_2->rawLen;
  pIVar3 = args_2->info;
  TVar15 = args_3->kind;
  uVar16 = args_3->field_0x2;
  NVar17.raw = (args_3->numFlags).raw;
  uVar18 = args_3->rawLen;
  pIVar4 = args_3->info;
  TVar19 = args_4->kind;
  uVar20 = args_4->field_0x2;
  NVar21.raw = (args_4->numFlags).raw;
  uVar22 = args_4->rawLen;
  pIVar5 = args_4->info;
  pEVar1 = *args_5;
  TVar23 = args_6->kind;
  uVar24 = args_6->field_0x2;
  NVar25.raw = (args_6->numFlags).raw;
  uVar26 = args_6->rawLen;
  pIVar6 = args_6->info;
  slang::syntax::MemberSyntax::MemberSyntax((MemberSyntax *)this_00,ExplicitAnsiPort,args);
  (this_00->direction).kind = TVar7;
  (this_00->direction).field_0x2 = uVar8;
  (this_00->direction).numFlags = (NumericTokenFlags)NVar9.raw;
  (this_00->direction).rawLen = uVar10;
  (this_00->direction).info = pIVar2;
  (this_00->dot).kind = TVar11;
  (this_00->dot).field_0x2 = uVar12;
  (this_00->dot).numFlags = (NumericTokenFlags)NVar13.raw;
  (this_00->dot).rawLen = uVar14;
  (this_00->dot).info = pIVar3;
  (this_00->name).kind = TVar15;
  (this_00->name).field_0x2 = uVar16;
  (this_00->name).numFlags = (NumericTokenFlags)NVar17.raw;
  (this_00->name).rawLen = uVar18;
  (this_00->name).info = pIVar4;
  (this_00->openParen).kind = TVar19;
  (this_00->openParen).field_0x2 = uVar20;
  (this_00->openParen).numFlags = (NumericTokenFlags)NVar21.raw;
  (this_00->openParen).rawLen = uVar22;
  (this_00->openParen).info = pIVar5;
  this_00->expr = pEVar1;
  (this_00->closeParen).kind = TVar23;
  (this_00->closeParen).field_0x2 = uVar24;
  (this_00->closeParen).numFlags = (NumericTokenFlags)NVar25.raw;
  (this_00->closeParen).rawLen = uVar26;
  (this_00->closeParen).info = pIVar6;
  if (pEVar1 != (ExpressionSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = (SyntaxNode *)this_00;
  }
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }